

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipTimer.h
# Opt level: O0

void __thiscall
MipTimer::csvEvaluateRootNodeClock
          (MipTimer *this,string *model_name,HighsTimerClock *mip_timer_clock,bool header,
          bool end_line)

{
  byte in_CL;
  string *in_RSI;
  byte in_R8B;
  vector<int,_std::allocator<int>_> mip_clock_list;
  allocator *this_00;
  allocator_type *__a;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff00;
  initializer_list<int> in_stack_ffffffffffffff08;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff18;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff20;
  undefined1 in_stack_ffffffffffffff3a;
  undefined1 in_stack_ffffffffffffff3b;
  HighsInt in_stack_ffffffffffffff3c;
  HighsTimerClock *in_stack_ffffffffffffff40;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff48;
  string *in_stack_ffffffffffffff50;
  string *in_stack_ffffffffffffff58;
  MipTimer *in_stack_ffffffffffffff60;
  allocator_type local_89;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 *local_48;
  undefined8 local_40;
  byte local_1a;
  byte local_19;
  
  local_19 = in_CL & 1;
  local_1a = in_R8B & 1;
  local_58 = 0x200000001f;
  uStack_50 = 0x2200000021;
  local_68 = 0x1c0000001b;
  uStack_60 = 0x1e0000001d;
  local_78 = 0x1800000017;
  uStack_70 = 0x1a00000019;
  local_88 = 0x1400000013;
  uStack_80 = 0x1600000015;
  local_48 = &local_88;
  local_40 = 0x10;
  __a = &local_89;
  std::allocator<int>::allocator((allocator<int> *)0x611651);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff00,in_stack_ffffffffffffff08,__a);
  std::allocator<int>::~allocator((allocator<int> *)0x611682);
  this_00 = (allocator *)&stack0xffffffffffffff3f;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&stack0xffffffffffffff40,"csvRootNode",this_00);
  std::__cxx11::string::string((string *)&stack0xffffffffffffff18,in_RSI);
  std::vector<int,_std::allocator<int>_>::vector
            (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
  csvMipClockList(in_stack_ffffffffffffff60,in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                  in_stack_ffffffffffffff48,in_stack_ffffffffffffff40,in_stack_ffffffffffffff3c,
                  (bool)in_stack_ffffffffffffff3b,(bool)in_stack_ffffffffffffff3a);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff40);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffff3f);
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)this_00);
  return;
}

Assistant:

void csvEvaluateRootNodeClock(const std::string model_name,
                                const HighsTimerClock& mip_timer_clock,
                                const bool header, const bool end_line) {
    const std::vector<HighsInt> mip_clock_list{
        kMipClockStartSymmetryDetection,
        kMipClockStartAnalyticCentreComputation,
        kMipClockEvaluateRootLp,
        kMipClockSeparateLpCuts,
        kMipClockRandomizedRounding,
        kMipClockPerformRestart,
        kMipClockRootSeparation,
        kMipClockFinishAnalyticCentreComputation,
        kMipClockRootCentralRounding,
        kMipClockRootSeparationRound0,
        kMipClockRootHeuristicsReducedCost,
        kMipClockRootSeparationRound1,
        kMipClockRootHeuristicsRens,
        kMipClockRootSeparationRound2,
        kMipClockRootFeasibilityPump,
        kMipClockRootSeparationRound3};
    csvMipClockList("csvRootNode", model_name, mip_clock_list, mip_timer_clock,
                    kMipClockEvaluateRootNode, header, end_line);
  }